

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspCliConfig::ClaspCliConfig(ClaspCliConfig *this)

{
  undefined8 *in_RDI;
  string *local_28;
  ClaspConfig *in_stack_fffffffffffffff0;
  
  ClaspConfig::ClaspConfig(in_stack_fffffffffffffff0);
  *in_RDI = &PTR__ClaspCliConfig_002dc3e0;
  SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::SingleOwnerPtr
            ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
             (in_RDI + 0x1a));
  in_RDI[0x1b] = 0;
  local_28 = (string *)(in_RDI + 0x1c);
  do {
    std::__cxx11::string::string(local_28);
    local_28 = local_28 + 0x20;
  } while (local_28 != (string *)(in_RDI + 0x24));
  *(undefined1 *)(in_RDI + 0x24) = 0;
  return;
}

Assistant:

ClaspCliConfig::ClaspCliConfig() : parseCtx_(0), validate_(false) {
	static_assert(
		(option_category_context_begin< option_category_solver_begin) &&
		(option_category_solver_begin < option_category_search_begin) &&
		(option_category_search_begin < option_category_asp_begin)    &&
		(option_category_asp_begin    < option_category_solve_begin)  &&
		(option_category_solve_begin  < option_category_solve_end), "unexpected option order");
}